

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

void iCopyColors<cI16,cBGRA,bCopy>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  BYTE BVar2;
  undefined2 uVar3;
  int iVar4;
  int iVar5;
  FSpecialColormap *pFVar6;
  long lVar7;
  byte *pbVar8;
  BYTE *pBVar9;
  long lVar10;
  int iVar11;
  
  pFVar6 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_004db139_caseD_0:
    if (0 < count) {
      pBVar9 = pin + 1;
      lVar7 = 0;
      do {
        BVar2 = *pBVar9;
        pout[lVar7 * 4 + 2] = BVar2;
        pout[lVar7 * 4 + 1] = BVar2;
        pout[lVar7 * 4] = *pBVar9;
        pout[lVar7 * 4 + 3] = 0xff;
        lVar7 = lVar7 + 1;
        pBVar9 = pBVar9 + step;
      } while (count != (int)lVar7);
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_004db139_caseD_0;
    case BLEND_ICEMAP:
      if (0 < count) {
        pbVar8 = pin + 1;
        lVar7 = 0;
        do {
          bVar1 = *pbVar8 >> 4;
          BVar2 = IcePalette[bVar1][1];
          pout[lVar7 * 4 + 2] = IcePalette[bVar1][0];
          pout[lVar7 * 4 + 1] = BVar2;
          pout[lVar7 * 4] = IcePalette[bVar1][2];
          pout[lVar7 * 4 + 3] = 0xff;
          lVar7 = lVar7 + 1;
          pbVar8 = pbVar8 + step;
        } while (count != (int)lVar7);
      }
      break;
    case BLEND_OVERLAY:
      if (0 < count) {
        pbVar8 = pin + 1;
        lVar7 = 0;
        do {
          iVar11 = (uint)*pbVar8 * inf->blendcolor[3];
          iVar4 = inf->blendcolor[1];
          iVar5 = inf->blendcolor[2];
          pout[lVar7 * 4 + 2] = (BYTE)((uint)(inf->blendcolor[0] + iVar11) >> 0x10);
          pout[lVar7 * 4 + 1] = (BYTE)((uint)(iVar4 + iVar11) >> 0x10);
          pout[lVar7 * 4] = (BYTE)((uint)(iVar11 + iVar5) >> 0x10);
          pout[lVar7 * 4 + 3] = 0xff;
          lVar7 = lVar7 + 1;
          pbVar8 = pbVar8 + step;
        } while (count != (int)lVar7);
      }
      break;
    case BLEND_MODULATE:
      if (0 < count) {
        pbVar8 = pin + 1;
        lVar7 = 0;
        do {
          bVar1 = *pbVar8;
          iVar4 = inf->blendcolor[1];
          iVar5 = inf->blendcolor[2];
          pout[lVar7 * 4 + 2] = (BYTE)(inf->blendcolor[0] * (uint)bVar1 >> 0x10);
          pout[lVar7 * 4 + 1] = (BYTE)(iVar4 * (uint)bVar1 >> 0x10);
          pout[lVar7 * 4] = (BYTE)((uint)bVar1 * iVar5 >> 0x10);
          pout[lVar7 * 4 + 3] = 0xff;
          lVar7 = lVar7 + 1;
          pbVar8 = pbVar8 + step;
        } while (count != (int)lVar7);
      }
      break;
    default:
      lVar7 = (long)inf->blend;
      if (lVar7 < 0x21) {
        if (0 < count && BLEND_ICEMAP < inf->blend) {
          pBVar9 = pin + 1;
          lVar7 = 0;
          do {
            BVar2 = *pBVar9;
            pout[lVar7 * 4 + 2] = BVar2;
            pout[lVar7 * 4 + 1] = BVar2;
            pout[lVar7 * 4] = BVar2;
            pout[lVar7 * 4 + 3] = 0xff;
            lVar7 = lVar7 + 1;
            pBVar9 = pBVar9 + step;
          } while (count != (int)lVar7);
        }
      }
      else if (0 < count) {
        pbVar8 = pin + 1;
        lVar10 = 0;
        do {
          uVar3 = *(undefined2 *)((long)pFVar6 + (ulong)*pbVar8 * 4 + lVar7 * 0x518 + -0xa700);
          pout[lVar10 * 4 + 2] =
               *(BYTE *)((long)pFVar6 + (ulong)*pbVar8 * 4 + lVar7 * 0x518 + -0xa6fe);
          *(undefined2 *)(pout + lVar10 * 4) = uVar3;
          pout[lVar10 * 4 + 3] = 0xff;
          lVar10 = lVar10 + 1;
          pbVar8 = pbVar8 + step;
        } while (count != (int)lVar10);
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}